

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

substr __thiscall
c4::yml::Parser::_scan_plain_scalar_blck
          (Parser *this,csubstr currscalar,csubstr peeked_line,size_t indentation)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  char *s_;
  char *pcVar12;
  bool bVar13;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr chars;
  ro_substr pattern_01;
  ro_substr pattern_02;
  ro_substr pattern_03;
  ro_substr chars_00;
  substr sVar14;
  csubstr cVar15;
  basic_substring<const_char> bVar16;
  basic_substring<char> bVar17;
  csubstr local_148;
  char msg [43];
  char *pcStack_c8;
  size_t local_c0;
  char *pcStack_a0;
  size_t local_98;
  char *pcStack_78;
  size_t local_70;
  char *pcStack_50;
  size_t local_48;
  basic_substring<char> local_40;
  
  sVar10 = currscalar.len;
  s_ = currscalar.str;
  sVar8 = (this->m_buf).len;
  local_148 = peeked_line;
  if (sVar8 == 0) {
    if (sVar10 == 0) {
      pcVar12 = (this->m_buf).str;
      bVar7 = pcVar12 == s_;
      bVar13 = pcVar12 != (char *)0x0;
      pcVar12 = s_;
      goto LAB_001cf021;
    }
  }
  else {
    pcVar12 = (this->m_buf).str;
    bVar7 = pcVar12 <= s_;
    bVar13 = s_ + sVar10 <= pcVar12 + sVar8;
LAB_001cf021:
    if ((bool)(bVar7 & bVar13)) goto LAB_001cf0dc;
  }
  builtin_strncpy(msg + 0x20,"rrscalar))",0xb);
  builtin_strncpy(msg + 0x10,"_buf.is_super(cu",0x10);
  builtin_strncpy(msg,"check failed: (m",0x10);
  if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
    pcVar2 = (code *)swi(3);
    sVar14 = (substr)(*pcVar2)();
    return sVar14;
  }
  p_Var1 = (this->m_stack).m_callbacks.m_error;
  cVar15 = to_csubstr(
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     );
  local_48 = cVar15.len;
  pcStack_50 = cVar15.str;
  LVar3.super_LineCol.col = 0;
  LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7586) << 0x40,0);
  LVar3.super_LineCol.line = SUB168(ZEXT816(0x7586) << 0x40,8);
  LVar3.name.str = pcStack_50;
  LVar3.name.len = local_48;
  (*p_Var1)(msg,0x2b,LVar3,(this->m_stack).m_callbacks.m_user_data);
  pcVar12 = (this->m_buf).str;
LAB_001cf0dc:
  if (s_ + sVar10 < pcVar12) {
    builtin_strncpy(msg + 0x20,">= m_buf.be",0xb);
    builtin_strncpy(msg + 0x10,"urrscalar.end() ",0x10);
    builtin_strncpy(msg,"check failed: (c",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar2 = (code *)swi(3);
      sVar14 = (substr)(*pcVar2)();
      return sVar14;
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar15 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_70 = cVar15.len;
    pcStack_78 = cVar15.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7589) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x7589) << 0x40,8);
    LVar4.name.str = pcStack_78;
    LVar4.name.len = local_70;
    (*p_Var1)(msg,0x32,LVar4,(this->m_stack).m_callbacks.m_user_data);
    pcVar12 = (this->m_buf).str;
  }
  bVar7 = basic_substring<const_char>::begins_with(&local_148,' ',indentation);
  if (!bVar7) {
    builtin_strncpy(msg + 0x20,"s_with(\' \',",0xb);
    builtin_strncpy(msg + 0x10,"eeked_line.begin",0x10);
    builtin_strncpy(msg,"check failed: (p",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar2 = (code *)swi(3);
      sVar14 = (substr)(*pcVar2)();
      return sVar14;
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar15 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_98 = cVar15.len;
    pcStack_a0 = cVar15.str;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x758b) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x758b) << 0x40,8);
    LVar5.name.str = pcStack_a0;
    LVar5.name.len = local_98;
    (*p_Var1)(msg,0x3a,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar11 = (long)(s_ + sVar10) - (long)pcVar12;
  do {
    pattern.len = 3;
    pattern.str = "...";
    bVar7 = basic_substring<const_char>::begins_with(&local_148,pattern);
    if ((bVar7) ||
       (pattern_00.len = 3, pattern_00.str = "---",
       bVar7 = basic_substring<const_char>::begins_with(&local_148,pattern_00), bVar7))
    goto LAB_001cf43f;
    bVar7 = basic_substring<const_char>::begins_with(&local_148,' ',indentation);
    cVar15 = local_148;
    if (!bVar7) {
      chars.len = 4;
      chars.str = " \r\n\t";
      bVar16 = basic_substring<const_char>::trim(&local_148,chars);
      if (bVar16.str != (char *)0x0 && bVar16.len != 0) goto LAB_001cf43f;
      cVar15 = _scan_to_next_nonempty_line(this,indentation);
      if ((cVar15.len == 0) || (cVar15.str == (char *)0x0)) goto LAB_001cf43f;
    }
    local_148 = cVar15;
    pattern_01.len = 2;
    pattern_01.str = ": ";
    sVar8 = basic_substring<const_char>::find(&local_148,pattern_01,0);
    if (sVar8 == 0xffffffffffffffff) {
      if ((local_148.len != 0) && (local_148.str[local_148.len - 1] == ':')) {
        sVar8 = basic_substring<const_char>::first_of(&local_148,':',0);
        _line_progressed(this,sVar8);
        bVar7 = is_debugger_attached();
        pcVar12 = "ERROR: lines cannot end with \':\' in plain flow (unquoted) scalars";
        if (bVar7) {
          bVar7 = is_debugger_attached();
          pcVar12 = "ERROR: lines cannot end with \':\' in plain flow (unquoted) scalars";
          if (bVar7) {
            pcVar2 = (code *)swi(3);
            sVar14 = (substr)(*pcVar2)();
            return sVar14;
          }
        }
        goto LAB_001cf3ec;
      }
      pattern_03.len = 2;
      pattern_03.str = " #";
      sVar8 = basic_substring<const_char>::find(&local_148,pattern_03,0);
      if (sVar8 != 0xffffffffffffffff) {
        _line_progressed(this,sVar8);
LAB_001cf43f:
        uVar9 = (this->m_state->pos).super_LineCol.offset;
        if (uVar9 < uVar11) {
          builtin_strncpy(msg + 0x20,"et >= offs)",0xb);
          builtin_strncpy(msg + 0x10,"_state->pos.offs",0x10);
          builtin_strncpy(msg,"check failed: (m",0x10);
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            sVar14 = (substr)(*pcVar2)();
            return sVar14;
          }
          p_Var1 = (this->m_stack).m_callbacks.m_error;
          cVar15 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_c0 = cVar15.len;
          pcStack_c8 = cVar15.str;
          LVar6.super_LineCol.col = 0;
          LVar6.super_LineCol.offset = SUB168(ZEXT816(0x75c2) << 0x40,0);
          LVar6.super_LineCol.line = SUB168(ZEXT816(0x75c2) << 0x40,8);
          LVar6.name.str = pcStack_c8;
          LVar6.name.len = local_c0;
          (*p_Var1)(msg,0x2c,LVar6,(this->m_stack).m_callbacks.m_user_data);
          uVar9 = (this->m_state->pos).super_LineCol.offset;
        }
        basic_substring<char>::basic_substring(&local_40,s_,(sVar10 - uVar11) + uVar9);
        chars_00.len = 3;
        chars_00.str = "\r\n ";
        bVar17 = basic_substring<char>::trimr(&local_40,chars_00);
        sVar14.str = bVar17.str;
        sVar14.len = bVar17.len;
        return sVar14;
      }
    }
    else {
      pattern_02.len = 2;
      pattern_02.str = ": ";
      sVar8 = basic_substring<const_char>::find(&local_148,pattern_02,0);
      _line_progressed(this,sVar8);
      bVar7 = is_debugger_attached();
      pcVar12 = "ERROR: \': \' is not a valid token in plain flow (unquoted) scalars";
      if (bVar7) {
        bVar7 = is_debugger_attached();
        pcVar12 = "ERROR: \': \' is not a valid token in plain flow (unquoted) scalars";
        if (bVar7) {
          pcVar2 = (code *)swi(3);
          sVar14 = (substr)(*pcVar2)();
          return sVar14;
        }
      }
LAB_001cf3ec:
      cVar15.len = 0x41;
      cVar15.str = pcVar12;
      _err<>(this,cVar15);
    }
    bVar7 = _advance_to_peeked(this);
    if (!bVar7) goto LAB_001cf43f;
    local_148 = (this->m_state->line_contents).rem;
  } while( true );
}

Assistant:

substr Parser::_scan_plain_scalar_blck(csubstr currscalar, csubstr peeked_line, size_t indentation)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(currscalar));
    // NOTE. there's a problem with _scan_to_next_nonempty_line(), as it counts newlines twice
    // size_t offs = m_state->pos.offset;   // so we workaround by directly counting from the end of the given scalar
    _RYML_CB_ASSERT(m_stack.m_callbacks, currscalar.end() >= m_buf.begin());
    size_t offs = static_cast<size_t>(currscalar.end() - m_buf.begin());
    _RYML_CB_ASSERT(m_stack.m_callbacks, peeked_line.begins_with(' ', indentation));
    while(true)
    {
        _c4dbgpf("rscalar[IMPL]: continuing... ref_indentation={}", indentation);
        if(peeked_line.begins_with("...") || peeked_line.begins_with("---"))
        {
            _c4dbgpf("rscalar[IMPL]: document termination next -- bail now '{}'", peeked_line.trimr("\r\n"));
            break;
        }
        else if(( ! peeked_line.begins_with(' ', indentation))) // is the line deindented?
        {
            if(!peeked_line.trim(" \r\n\t").empty()) // is the line not blank?
            {
                _c4dbgpf("rscalar[IMPL]: deindented line, not blank -- bail now '{}'", peeked_line.trimr("\r\n"));
                break;
            }
            _c4dbgpf("rscalar[IMPL]: line is blank and has less indentation: ref={} line={}: '{}'", indentation, peeked_line.first_not_of(' ') == csubstr::npos ? 0 : peeked_line.first_not_of(' '), peeked_line.trimr("\r\n"));
            _c4dbgpf("rscalar[IMPL]: ... searching for a line starting at indentation {}", indentation);
            csubstr next_peeked = _scan_to_next_nonempty_line(indentation);
            if(next_peeked.empty())
            {
                _c4dbgp("rscalar[IMPL]: ... finished.");
                break;
            }
            _c4dbgp("rscalar[IMPL]: ... continuing.");
            peeked_line = next_peeked;
        }

        _c4dbgpf("rscalar[IMPL]: line contents: '{}'", peeked_line.right_of(indentation, true).trimr("\r\n"));
        size_t token_pos;
        if(peeked_line.find(": ") != npos)
        {
            _line_progressed(peeked_line.find(": "));
            _c4err("': ' is not a valid token in plain flow (unquoted) scalars");
        }
        else if(peeked_line.ends_with(':'))
        {
            _line_progressed(peeked_line.find(':'));
            _c4err("lines cannot end with ':' in plain flow (unquoted) scalars");
        }
        else if((token_pos = peeked_line.find(" #")) != npos)
        {
            _line_progressed(token_pos);
            break;
            //_c4err("' #' is not a valid token in plain flow (unquoted) scalars");
        }

        _c4dbgpf("rscalar[IMPL]: append another line: (len={})'{}'", peeked_line.len, peeked_line.trimr("\r\n"));
        if(!_advance_to_peeked())
        {
            _c4dbgp("rscalar[IMPL]: file finishes after the scalar");
            break;
        }
        peeked_line = m_state->line_contents.rem;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= offs);
    substr full(m_buf.str + (currscalar.str - m_buf.str),
                currscalar.len + (m_state->pos.offset - offs));
    full = full.trimr("\r\n ");
    return full;
}